

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointConnection::~IfcStructuralPointConnection
          (IfcStructuralPointConnection *this)

{
  ~IfcStructuralPointConnection
            ((IfcStructuralPointConnection *)
             (&(this->super_IfcStructuralConnection).field_0x0 +
             *(long *)(*(long *)&this->super_IfcStructuralConnection + -0x18)));
  return;
}

Assistant:

IfcStructuralPointConnection() : Object("IfcStructuralPointConnection") {}